

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<int_const&>::operator!=
          (result *__return_storage_ptr__,expression_lhs<int_const&> *this,double *rhs)

{
  int *lhs;
  allocator local_41;
  string local_40 [32];
  double *local_20;
  double *rhs_local;
  expression_lhs<const_int_&> *this_local;
  
  __return_storage_ptr__->passed = (double)**(int **)this != *rhs;
  lhs = *(int **)this;
  local_20 = rhs;
  rhs_local = (double *)this;
  this_local = (expression_lhs<const_int_&> *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"!=",&local_41);
  to_string<int,double>
            ((lest *)&__return_storage_ptr__->decomposition,lhs,(string *)local_40,local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return __return_storage_ptr__;
}

Assistant:

result operator!=( R const & rhs ) { return result{ lhs != rhs, to_string( lhs, "!=", rhs ) }; }